

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall
duckdb::Node::Vacuum
          (Node *this,ART *art,
          unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
          *indexes)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  NType NVar3;
  _Elt_pointer pNVar4;
  type paVar5;
  long *plVar6;
  pointer pFVar7;
  data_ptr_t pdVar8;
  InternalException *this_00;
  long *plVar9;
  uint uVar10;
  idx_t i;
  Node *pNVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ARTScanner<(duckdb::ARTScanHandling)0,_duckdb::Node> scanner;
  Prefix prefix;
  anon_class_16_2_22db7666 handler;
  ART *local_d8;
  _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_duckdb::Node>::NodeEntry>_>
  local_d0;
  string local_80;
  anon_class_16_2_22db7666 local_60;
  string local_50;
  
  local_d0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d0._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_d0._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d0._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d0._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d0._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d0._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d0._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d0._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_d8 = art;
  ::std::
  _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_duckdb::Node>::NodeEntry>_>
  ::_M_initialize_map(&local_d0,0);
  local_60.art = art;
  local_60.indexes = indexes;
  ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node>::
  Emplace<duckdb::Node::Vacuum(duckdb::ART&,std::unordered_set<unsigned_char,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<unsigned_char>>const&)::__0&>
            ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node> *)&local_d8,&local_60,this);
  if (local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_d0._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pNVar4 = local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_d0._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pNVar4 = local_d0._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      if (pNVar4[-1].exhausted == true) {
        if (local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_d0._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_d0._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_d0._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_d0._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_d0._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_d0._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_d0._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_d0._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_d0._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      else {
        pNVar4[-1].exhausted = true;
        uVar14 = ((pNVar4[-1].node)->super_IndexPointer).data;
        NVar3 = (NType)(uVar14 >> 0x38);
        uVar10 = (uint)(uVar14 >> 0x20);
        switch(NVar3 & 0x7f) {
        case PREFIX:
          Prefix::Prefix((Prefix *)&local_80,local_d8,
                         (Node)((pNVar4[-1].node)->super_IndexPointer).data,true,false);
          ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node>::
          Emplace<duckdb::Node::Vacuum(duckdb::ART&,std::unordered_set<unsigned_char,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<unsigned_char>>const&)::__0&>
                    ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node> *)&local_d8,&local_60,
                     (Node *)local_80._M_string_length);
          break;
        case LEAF:
        case LEAF_INLINED:
        case NODE_7_LEAF:
        case NODE_15_LEAF:
        case NODE_256_LEAF:
          break;
        case NODE_4:
          paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_d8->allocators);
          _Var1._M_head_impl =
               paVar5->_M_elems[2].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                             ((uVar14 & 0xffffffff) %
                             *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
          for (plVar9 = (long *)*plVar6; (uVar14 & 0xffffffff) != plVar9[1];
              plVar9 = (long *)*plVar9) {
            plVar6 = plVar9;
          }
          pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)(*plVar6 + 0x10));
          pdVar8 = FixedSizeBuffer::Get(pFVar7,true);
          lVar12 = (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
          iVar2 = (_Var1._M_head_impl)->bitmask_offset;
          if (pdVar8[iVar2 + lVar12] != '\0') {
            uVar14 = 0;
            pNVar11 = (Node *)(pdVar8 + iVar2 + lVar12);
            do {
              pNVar11 = pNVar11 + 1;
              ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node>::
              Emplace<duckdb::Node::Vacuum(duckdb::ART&,std::unordered_set<unsigned_char,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<unsigned_char>>const&)::__0&>
                        ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node> *)&local_d8,&local_60,
                         pNVar11);
              uVar14 = uVar14 + 1;
            } while (uVar14 < (byte)(((Node *)(pdVar8 + iVar2 + lVar12))->super_IndexPointer).data);
          }
          break;
        case NODE_16:
          paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_d8->allocators);
          _Var1._M_head_impl =
               paVar5->_M_elems[3].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                             ((uVar14 & 0xffffffff) %
                             *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
          for (plVar9 = (long *)*plVar6; (uVar14 & 0xffffffff) != plVar9[1];
              plVar9 = (long *)*plVar9) {
            plVar6 = plVar9;
          }
          pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)(*plVar6 + 0x10));
          pdVar8 = FixedSizeBuffer::Get(pFVar7,true);
          lVar12 = (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
          iVar2 = (_Var1._M_head_impl)->bitmask_offset;
          if (pdVar8[iVar2 + lVar12] != '\0') {
            pNVar11 = (Node *)(pdVar8 + iVar2 + lVar12 + 0x18);
            uVar14 = 0;
            do {
              ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node>::
              Emplace<duckdb::Node::Vacuum(duckdb::ART&,std::unordered_set<unsigned_char,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<unsigned_char>>const&)::__0&>
                        ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node> *)&local_d8,&local_60,
                         pNVar11);
              uVar14 = uVar14 + 1;
              pNVar11 = pNVar11 + 1;
            } while (uVar14 < pdVar8[iVar2 + lVar12]);
          }
          break;
        case NODE_48:
          paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_d8->allocators);
          _Var1._M_head_impl =
               paVar5->_M_elems[4].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                             ((uVar14 & 0xffffffff) %
                             *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
          for (plVar9 = (long *)*plVar6; (uVar14 & 0xffffffff) != plVar9[1];
              plVar9 = (long *)*plVar9) {
            plVar6 = plVar9;
          }
          pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)(*plVar6 + 0x10));
          pdVar8 = FixedSizeBuffer::Get(pFVar7,true);
          lVar12 = (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
          iVar2 = (_Var1._M_head_impl)->bitmask_offset;
          lVar13 = 0;
          do {
            if ((ulong)pdVar8[lVar13 + iVar2 + lVar12 + 1] != 0x30) {
              ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node>::
              Emplace<duckdb::Node::Vacuum(duckdb::ART&,std::unordered_set<unsigned_char,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<unsigned_char>>const&)::__0&>
                        ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node> *)&local_d8,&local_60,
                         (Node *)(pdVar8 + (ulong)pdVar8[lVar13 + iVar2 + lVar12 + 1] * 8 +
                                           iVar2 + lVar12 + 0x108));
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x100);
          break;
        case NODE_256:
          paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_d8->allocators);
          _Var1._M_head_impl =
               paVar5->_M_elems[5].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                             ((uVar14 & 0xffffffff) %
                             *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
          for (plVar9 = (long *)*plVar6; (uVar14 & 0xffffffff) != plVar9[1];
              plVar9 = (long *)*plVar9) {
            plVar6 = plVar9;
          }
          pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)(*plVar6 + 0x10));
          pdVar8 = FixedSizeBuffer::Get(pFVar7,true);
          lVar12 = (_Var1._M_head_impl)->bitmask_offset +
                   (ulong)(uVar10 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
          lVar13 = 0;
          do {
            if (pdVar8[lVar13 + lVar12 + 0xf] != '\0') {
              ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node>::
              Emplace<duckdb::Node::Vacuum(duckdb::ART&,std::unordered_set<unsigned_char,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<unsigned_char>>const&)::__0&>
                        ((ARTScanner<(duckdb::ARTScanHandling)0,duckdb::Node> *)&local_d8,&local_60,
                         (Node *)(pdVar8 + lVar13 + lVar12 + 8));
            }
            lVar13 = lVar13 + 8;
          } while (lVar13 != 0x800);
          break;
        default:
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,"invalid node type for ART ScanHandleLast: %s","");
          EnumUtil::ToString<duckdb::NType>(&local_50,NVar3 & 0x7f);
          InternalException::InternalException<std::__cxx11::string>(this_00,&local_80,&local_50);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    } while (local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_d0._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  ::std::
  _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)0,_duckdb::Node>::NodeEntry>_>
  ::~_Deque_base(&local_d0);
  return;
}

Assistant:

void Node::Vacuum(ART &art, const unordered_set<uint8_t> &indexes) {
	D_ASSERT(HasMetadata());
	ARTScanner<ARTScanHandling::EMPLACE, Node> scanner(art);

	auto handler = [&art, &indexes](Node &node) {
		ARTScanHandlingResult result;
		const auto type = node.GetType();
		switch (type) {
		case NType::LEAF_INLINED:
			return ARTScanHandlingResult::SKIP;
		case NType::LEAF: {
			if (indexes.find(GetAllocatorIdx(type)) == indexes.end()) {
				return ARTScanHandlingResult::SKIP;
			}
			Leaf::DeprecatedVacuum(art, node);
			return ARTScanHandlingResult::SKIP;
		}
		case NType::NODE_7_LEAF:
		case NType::NODE_15_LEAF:
		case NType::NODE_256_LEAF: {
			result = ARTScanHandlingResult::SKIP;
			break;
		}
		case NType::PREFIX:
		case NType::NODE_4:
		case NType::NODE_16:
		case NType::NODE_48:
		case NType::NODE_256: {
			result = ARTScanHandlingResult::CONTINUE;
			break;
		}
		default:
			throw InternalException("invalid node type for Vacuum: %s", EnumUtil::ToString(type));
		}

		const auto idx = GetAllocatorIdx(type);
		auto &allocator = GetAllocator(art, type);
		const auto needs_vacuum = indexes.find(idx) != indexes.end() && allocator.NeedsVacuum(node);
		if (needs_vacuum) {
			const auto status = node.GetGateStatus();
			node = allocator.VacuumPointer(node);
			node.SetMetadata(static_cast<uint8_t>(type));
			node.SetGateStatus(status);
		}
		return result;
	};

	scanner.Init(handler, *this);
	scanner.Scan(handler);
}